

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::
TransformPromiseNode<kj::AuthenticatedStream,_kj::_::IdentityFunc<kj::Promise<kj::AuthenticatedStream>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/tls.c++:971:13)>
::getImpl(TransformPromiseNode<kj::AuthenticatedStream,_kj::_::IdentityFunc<kj::Promise<kj::AuthenticatedStream>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_compat_tls_c__:971:13)>
          *this,ExceptionOrValue *output)

{
  anon_union_400_1_a8c68091_for_NullableValue<kj::Exception>_2 *this_00;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::AuthenticatedStream>_>_2 aVar1;
  AsyncIoStream *pAVar2;
  PeerIdentity *pPVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  String *in_R8;
  ExceptionOr<kj::AuthenticatedStream> depResult;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::AuthenticatedStream>_>_2 local_3b0;
  AuthenticatedStream local_3a8;
  ExceptionOrValue local_388;
  byte local_1f0;
  Disposer *local_1e8;
  AsyncIoStream *pAStack_1e0;
  Disposer *local_1d8;
  PeerIdentity *pPStack_1d0;
  ExceptionOr<kj::Promise<kj::AuthenticatedStream>_> local_1c8;
  
  local_388.exception.ptr.isSet = false;
  local_1f0 = 0;
  TransformPromiseNodeBase::getDepResult(&this->super_TransformPromiseNodeBase,&local_388);
  this_00 = &local_388.exception.ptr.field_1;
  if (local_388.exception.ptr.isSet == true) {
    if (local_388.exception.ptr.field_1.value.description.content.size_ == 0) {
      local_388.exception.ptr.field_1.value.description.content.ptr = "";
    }
    local_3a8.stream.ptr =
         (AsyncIoStream *)
         (local_388.exception.ptr.field_1.value.description.content.size_ +
         (local_388.exception.ptr.field_1.value.description.content.size_ == 0));
    local_3a8.stream.disposer =
         (Disposer *)local_388.exception.ptr.field_1.value.description.content.ptr;
    str<kj::StringPtr,char_const(&)[14],kj::String_const&>
              ((String *)&local_1c8,(kj *)&local_3a8,(StringPtr *)"; clientId = ",
               (char (*) [14])&this->errorHandler,in_R8);
    Exception::setDescription(&this_00->value,(String *)&local_1c8);
    uVar5 = local_1c8.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.ptr;
    uVar4 = local_1c8.super_ExceptionOrValue.exception.ptr._0_8_;
    if (local_1c8.super_ExceptionOrValue.exception.ptr._0_8_ != 0) {
      local_1c8.super_ExceptionOrValue.exception.ptr._0_8_ = 0;
      local_1c8.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.ptr = (char *)0x0
      ;
      (*(code *)**(undefined8 **)
                  local_1c8.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.size_
      )(local_1c8.super_ExceptionOrValue.exception.ptr.field_1.value.ownFile.content.size_,uVar4,1,
        uVar5,uVar5,0);
    }
    throwFatalException(&this_00->value,0);
  }
  if (local_1f0 == 1) {
    local_3a8.stream.disposer = local_1e8;
    local_3a8.stream.ptr = pAStack_1e0;
    pAStack_1e0 = (AsyncIoStream *)0x0;
    local_3a8.peerIdentity.disposer = local_1d8;
    local_3a8.peerIdentity.ptr = pPStack_1d0;
    pPStack_1d0 = (PeerIdentity *)0x0;
    PromiseDisposer::
    alloc<kj::_::ImmediatePromiseNode<kj::AuthenticatedStream>,kj::_::PromiseDisposer,kj::AuthenticatedStream>
              ((PromiseDisposer *)&local_3b0.value,&local_3a8);
    pPVar3 = local_3a8.peerIdentity.ptr;
    if (local_3a8.peerIdentity.ptr != (PeerIdentity *)0x0) {
      local_3a8.peerIdentity.ptr = (PeerIdentity *)0x0;
      (**(local_3a8.peerIdentity.disposer)->_vptr_Disposer)
                (local_3a8.peerIdentity.disposer,
                 (_func_int *)
                 ((long)&pPVar3->_vptr_PeerIdentity + (long)pPVar3->_vptr_PeerIdentity[-2]));
    }
    pAVar2 = local_3a8.stream.ptr;
    if (local_3a8.stream.ptr != (AsyncIoStream *)0x0) {
      local_3a8.stream.ptr = (AsyncIoStream *)0x0;
      (**(local_3a8.stream.disposer)->_vptr_Disposer)
                (local_3a8.stream.disposer,
                 (_func_int *)
                 ((long)&(pAVar2->super_AsyncInputStream)._vptr_AsyncInputStream +
                 (long)(pAVar2->super_AsyncInputStream)._vptr_AsyncInputStream[-2]));
    }
    local_1c8.super_ExceptionOrValue.exception.ptr._0_8_ =
         local_1c8.super_ExceptionOrValue.exception.ptr._0_8_ & 0xffffffffffffff00;
    local_1c8.value.ptr.isSet = true;
    local_1c8.value.ptr.field_1 = local_3b0;
    local_3b0 = (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::AuthenticatedStream>_>_2)
                0x0;
    ExceptionOr<kj::Promise<kj::AuthenticatedStream>_>::operator=
              ((ExceptionOr<kj::Promise<kj::AuthenticatedStream>_> *)output,&local_1c8);
    aVar1 = local_1c8.value.ptr.field_1;
    if ((local_1c8.value.ptr.isSet == true) &&
       (local_1c8.value.ptr.field_1 !=
        (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::AuthenticatedStream>_>_2)0x0)) {
      local_1c8.value.ptr.field_1 =
           (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::AuthenticatedStream>_>_2)0x0;
      PromiseDisposer::dispose((PromiseArenaMember *)aVar1);
    }
    if (local_1c8.super_ExceptionOrValue.exception.ptr.isSet == true) {
      Exception::~Exception(&local_1c8.super_ExceptionOrValue.exception.ptr.field_1.value);
    }
    aVar1 = local_3b0;
    if (local_3b0 !=
        (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::AuthenticatedStream>_>_2)0x0) {
      local_3b0 = (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<kj::AuthenticatedStream>_>_2
                   )0x0;
      PromiseDisposer::dispose((PromiseArenaMember *)aVar1);
    }
  }
  pPVar3 = pPStack_1d0;
  if ((local_1f0 & 1) != 0) {
    if (pPStack_1d0 != (PeerIdentity *)0x0) {
      pPStack_1d0 = (PeerIdentity *)0x0;
      (**local_1d8->_vptr_Disposer)
                (local_1d8,
                 (_func_int *)
                 ((long)&pPVar3->_vptr_PeerIdentity + (long)pPVar3->_vptr_PeerIdentity[-2]));
    }
    pAVar2 = pAStack_1e0;
    if (pAStack_1e0 != (AsyncIoStream *)0x0) {
      pAStack_1e0 = (AsyncIoStream *)0x0;
      (**local_1e8->_vptr_Disposer)
                (local_1e8,
                 (_func_int *)
                 ((long)&(pAVar2->super_AsyncInputStream)._vptr_AsyncInputStream +
                 (long)(pAVar2->super_AsyncInputStream)._vptr_AsyncInputStream[-2]));
    }
  }
  if (local_388.exception.ptr.isSet == true) {
    Exception::~Exception(&this_00->value);
  }
  return;
}

Assistant:

void getImpl(ExceptionOrValue& output) override {
    // Derive return type from DepT to reduce templating.
    typedef _::FixVoid<_::ReturnType<Func, _DepT>> T;
    typedef _::FixVoid<_DepT> DepT;
    ExceptionOr<DepT> depResult;
    getDepResult(depResult);
    KJ_IF_SOME(depException, depResult.exception) {
      output.as<T>() = handle<T>(
          MaybeVoidCaller<Exception, FixVoid<ReturnType<ErrorFunc, Exception>>>::apply(
              errorHandler, kj::mv(depException)));
    } else KJ_IF_SOME(depValue, depResult.value) {
      output.as<T>() = handle(MaybeVoidCaller<DepT, T>::apply(func, kj::mv(depValue)));
    }
  }